

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBOrderGenerator.cpp
# Opt level: O2

vector<ASBlock_*,_std::allocator<ASBlock_*>_> * __thiscall
BBOrderGenerator::getASMBBOrder
          (vector<ASBlock_*,_std::allocator<ASBlock_*>_> *__return_storage_ptr__,
          BBOrderGenerator *this,
          map<Value_*,_ASValue_*,_std::less<Value_*>,_std::allocator<std::pair<Value_*const,_ASValue_*>_>_>
          *map)

{
  mapped_type *ppAVar1;
  pointer ppBVar2;
  ASBlock *asm_bb;
  BasicBlock *local_50;
  _Vector_base<BasicBlock_*,_std::allocator<BasicBlock_*>_> local_48;
  
  (__return_storage_ptr__->super__Vector_base<ASBlock_*,_std::allocator<ASBlock_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ASBlock_*,_std::allocator<ASBlock_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ASBlock_*,_std::allocator<ASBlock_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<BasicBlock_*,_std::allocator<BasicBlock_*>_>::vector
            ((vector<BasicBlock_*,_std::allocator<BasicBlock_*>_> *)&local_48,&this->_queue);
  ppBVar2 = local_48._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (ppBVar2 == local_48._M_impl.super__Vector_impl_data._M_finish) {
      std::_Vector_base<BasicBlock_*,_std::allocator<BasicBlock_*>_>::~_Vector_base(&local_48);
      return __return_storage_ptr__;
    }
    local_50 = *ppBVar2;
    ppAVar1 = std::
              map<Value_*,_ASValue_*,_std::less<Value_*>,_std::allocator<std::pair<Value_*const,_ASValue_*>_>_>
              ::operator[](map,(key_type *)&local_50);
    if (*ppAVar1 == (mapped_type)0x0) break;
    asm_bb = (ASBlock *)__dynamic_cast(*ppAVar1,&ASValue::typeinfo,&ASBlock::typeinfo,0);
    if (asm_bb == (ASBlock *)0x0) goto LAB_00171e5b;
    std::vector<ASBlock_*,_std::allocator<ASBlock_*>_>::push_back(__return_storage_ptr__,&asm_bb);
    ppBVar2 = ppBVar2 + 1;
  }
  asm_bb = (ASBlock *)0x0;
LAB_00171e5b:
  __assert_fail("asm_bb && \"Can\'t get ASM Block by BasicBlock\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zhuez16[P]bazinga_compiler/src/ASMIR/BBOrderGenerator.cpp"
                ,0x52,
                "std::vector<ASBlock *> BBOrderGenerator::getASMBBOrder(std::map<Value *, ASValue *> &)"
               );
}

Assistant:

std::vector<ASBlock *> BBOrderGenerator::getASMBBOrder(std::map<Value *, ASValue *> &map) {
    {
        std::vector<ASBlock *> ret;
        for (auto bb: getBBOrder()) {
            auto asm_bb = dynamic_cast<ASBlock *>(map[bb]);
            assert(asm_bb && "Can't get ASM Block by BasicBlock");
            ret.push_back(asm_bb);
        }
        return ret;
    }
}